

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__mad3sizes_valid(int a,int b,int c,int add)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined1 local_11;
  
  iVar1 = stbi__mul2sizes_valid(in_EDI,in_ESI);
  local_11 = false;
  if (iVar1 != 0) {
    iVar1 = stbi__mul2sizes_valid(in_EDI * in_ESI,in_EDX);
    local_11 = false;
    if (iVar1 != 0) {
      iVar1 = stbi__addsizes_valid(in_EDI * in_ESI * in_EDX,in_ECX);
      local_11 = iVar1 != 0;
    }
  }
  return (int)local_11;
}

Assistant:

static int stbi__mad3sizes_valid(int a, int b, int c, int add)
{
   return stbi__mul2sizes_valid(a, b) && stbi__mul2sizes_valid(a*b, c) &&
      stbi__addsizes_valid(a*b*c, add);
}